

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::getModifyIntensityApertureDiff_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int aperture,double size)

{
  size_t *psVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  mapped_type *pmVar5;
  _List_node_base *p_Var6;
  ulong uVar7;
  mapped_type mVar8;
  double dVar9;
  _List_node_base *local_48;
  key_type local_38;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  p_Var6 = (_List_node_base *)
           (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[aperture];
  if (0.0 <= (double)p_Var6 + size) {
    dVar9 = (double)this->max_intensity;
    local_48 = (_List_node_base *)size;
    if (dVar9 < (double)p_Var6 + size) {
      if (dVar9 <= (double)p_Var6) {
        return __return_storage_ptr__;
      }
      local_48 = (_List_node_base *)(dVar9 - (double)p_Var6);
    }
  }
  else {
    local_48 = p_Var6;
    if ((double)p_Var6 <= 0.0) {
      return __return_storage_ptr__;
    }
  }
  for (uVar7 = 0; iVar3 = Collimator::getXdim(this->collimator), (long)uVar7 < (long)iVar3;
      uVar7 = uVar7 + 1) {
    lVar2 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar4 = (long)*(int *)(lVar2 + uVar7 * 8);
    if ((-1 < lVar4) && (-1 < *(int *)(lVar2 + 4 + uVar7 * 8))) {
      local_38 = (key_type)(lVar4 << 0x20 | uVar7);
      pmVar5 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[](&this->pos2beam,&local_38);
      lVar2 = *(long *)&(this->A).
                        super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[aperture].
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data;
      iVar3 = *(int *)(lVar2 + uVar7 * 8);
      if (iVar3 <= *(int *)(lVar2 + 4 + uVar7 * 8)) {
        mVar8 = *pmVar5;
        iVar3 = iVar3 + -1;
        do {
          p_Var6 = (_List_node_base *)operator_new(0x20);
          *(mapped_type *)&p_Var6[1]._M_next = mVar8;
          p_Var6[1]._M_prev = local_48;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          mVar8 = mVar8 + 1;
          iVar3 = iVar3 + 1;
        } while (iVar3 < *(int *)(*(long *)&(this->A).
                                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                            ._M_impl.super__Vector_impl_data + 4 + uVar7 * 8));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

list <pair< int,double> > Station::getModifyIntensityApertureDiff (int aperture, double size) {
    list < pair <int, double > > diff;
    if ((intensity[aperture]+size) < 0 || (intensity[aperture]+size) > max_intensity) {
      if (intensity[aperture]+size < 0) {
        // Too low intensity
        if (intensity[aperture]>0)
          size = intensity[aperture];
        else
          return(diff);
      } else if ((intensity[aperture]+size) > max_intensity) {
        // Too high intensity
        if (intensity[aperture] < max_intensity)
          size = max_intensity - intensity[aperture];
        else 
          return(diff);
      } else {
        return (diff);
      }
    }
    for (int i=0; i<collimator.getXdim(); i++) {
      if (A[aperture][i].first<0 || A[aperture][i].second<0) 
        continue;
      int beamlet = pos2beam[make_pair(i, A[aperture][i].first)];
      for(int j=A[aperture][i].first; j<=A[aperture][i].second; j++){
        diff.push_back(make_pair(beamlet, size));
        beamlet++;
      }
    }
    return(diff);
    
  }